

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_avx2.c
# Opt level: O2

void iadst16_low1_avx2(__m256i *in,__m256i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined4 uVar1;
  __m256i alVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  __m256i alVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  __m256i alVar8;
  __m256i alVar9;
  __m256i alVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  byte bVar14;
  int iVar15;
  long lVar16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  __m256i clamp_hi_out;
  __m256i clamp_lo_out;
  __m256i in0;
  __m256i in1;
  longlong local_200;
  longlong lStack_1f8;
  longlong lStack_1f0;
  longlong lStack_1e8;
  int local_a0;
  int iStack_9c;
  int iStack_98;
  int iStack_94;
  int iStack_90;
  int iStack_8c;
  int iStack_88;
  int iStack_84;
  int local_80;
  int iStack_7c;
  int iStack_78;
  int iStack_74;
  int iStack_70;
  int iStack_6c;
  int iStack_68;
  int iStack_64;
  
  lVar16 = (long)bit * 0x100;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar16 + 0x168);
  auVar18._4_4_ = uVar1;
  auVar18._0_4_ = uVar1;
  auVar18._8_4_ = uVar1;
  auVar18._12_4_ = uVar1;
  auVar18._16_4_ = uVar1;
  auVar18._20_4_ = uVar1;
  auVar18._24_4_ = uVar1;
  auVar18._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar16 + 600);
  auVar17._4_4_ = uVar1;
  auVar17._0_4_ = uVar1;
  auVar17._8_4_ = uVar1;
  auVar17._12_4_ = uVar1;
  auVar17._16_4_ = uVar1;
  auVar17._20_4_ = uVar1;
  auVar17._24_4_ = uVar1;
  auVar17._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar16 + 0x180);
  auVar24._4_4_ = uVar1;
  auVar24._0_4_ = uVar1;
  auVar24._8_4_ = uVar1;
  auVar24._12_4_ = uVar1;
  auVar24._16_4_ = uVar1;
  auVar24._20_4_ = uVar1;
  auVar24._24_4_ = uVar1;
  auVar24._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar16 + 0x240);
  auVar25._4_4_ = uVar1;
  auVar25._0_4_ = uVar1;
  auVar25._8_4_ = uVar1;
  auVar25._12_4_ = uVar1;
  auVar25._16_4_ = uVar1;
  auVar25._20_4_ = uVar1;
  auVar25._24_4_ = uVar1;
  auVar25._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar16 + 0x220);
  auVar22._4_4_ = uVar1;
  auVar22._0_4_ = uVar1;
  auVar22._8_4_ = uVar1;
  auVar22._12_4_ = uVar1;
  auVar22._16_4_ = uVar1;
  auVar22._20_4_ = uVar1;
  auVar22._24_4_ = uVar1;
  auVar22._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar16 + 0x1a0);
  auVar23._4_4_ = uVar1;
  auVar23._0_4_ = uVar1;
  auVar23._8_4_ = uVar1;
  auVar23._12_4_ = uVar1;
  auVar23._16_4_ = uVar1;
  auVar23._20_4_ = uVar1;
  auVar23._24_4_ = uVar1;
  auVar23._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar16 + 0x1e0);
  auVar20._4_4_ = uVar1;
  auVar20._0_4_ = uVar1;
  auVar20._8_4_ = uVar1;
  auVar20._12_4_ = uVar1;
  auVar20._16_4_ = uVar1;
  auVar20._20_4_ = uVar1;
  auVar20._24_4_ = uVar1;
  auVar20._28_4_ = uVar1;
  iVar15 = 1 << ((char)bit - 1U & 0x1f);
  auVar21._4_4_ = iVar15;
  auVar21._0_4_ = iVar15;
  auVar21._8_4_ = iVar15;
  auVar21._12_4_ = iVar15;
  auVar21._16_4_ = iVar15;
  auVar21._20_4_ = iVar15;
  auVar21._24_4_ = iVar15;
  auVar21._28_4_ = iVar15;
  auVar17 = vpmulld_avx2((undefined1  [32])*in,auVar17);
  auVar17 = vpaddd_avx2(auVar17,auVar21);
  alVar2 = (__m256i)vpsrad_avx2(auVar17,ZEXT416((uint)bit));
  auVar17 = vpmulld_avx2((undefined1  [32])*in,auVar18);
  auVar17 = vpsubd_avx2(auVar21,auVar17);
  auVar3 = vpsrad_avx2(auVar17,ZEXT416((uint)bit));
  auVar17 = vpmulld_avx2((undefined1  [32])alVar2,auVar24);
  auVar18 = vpmulld_avx2(auVar3,auVar25);
  auVar17 = vpaddd_avx2(auVar17,auVar21);
  auVar17 = vpaddd_avx2(auVar18,auVar17);
  auVar19 = ZEXT416((uint)bit);
  auVar4 = vpsrad_avx2(auVar17,auVar19);
  auVar17 = vpmulld_avx2((undefined1  [32])alVar2,auVar25);
  auVar18 = vpmulld_avx2(auVar24,auVar3);
  auVar17 = vpaddd_avx2(auVar17,auVar21);
  auVar17 = vpsubd_avx2(auVar17,auVar18);
  alVar5 = (__m256i)vpsrad_avx2(auVar17,auVar19);
  auVar17 = vpmulld_avx2((undefined1  [32])alVar2,auVar23);
  auVar18 = vpmulld_avx2(auVar3,auVar22);
  auVar17 = vpaddd_avx2(auVar17,auVar21);
  auVar17 = vpaddd_avx2(auVar18,auVar17);
  auVar6 = vpsrad_avx2(auVar17,auVar19);
  auVar17 = vpmulld_avx2((undefined1  [32])alVar2,auVar22);
  auVar18 = vpmulld_avx2(auVar23,auVar3);
  auVar17 = vpaddd_avx2(auVar17,auVar21);
  auVar17 = vpsubd_avx2(auVar17,auVar18);
  auVar7 = vpsrad_avx2(auVar17,auVar19);
  auVar17 = vpmulld_avx2(auVar4,auVar23);
  auVar18 = vpmulld_avx2((undefined1  [32])alVar5,auVar22);
  auVar17 = vpaddd_avx2(auVar17,auVar21);
  auVar17 = vpaddd_avx2(auVar18,auVar17);
  auVar18 = vpmulld_avx2(auVar4,auVar22);
  auVar22 = vpmulld_avx2(auVar23,(undefined1  [32])alVar5);
  auVar18 = vpaddd_avx2(auVar18,auVar21);
  auVar11 = vpsubd_avx2(auVar18,auVar22);
  auVar18 = vpmulld_avx2((undefined1  [32])alVar2,auVar20);
  auVar23 = vpmulld_avx2(auVar3,auVar20);
  auVar18 = vpaddd_avx2(auVar18,auVar21);
  auVar22 = vpaddd_avx2(auVar23,auVar18);
  auVar12 = vpsubd_avx2(auVar18,auVar23);
  auVar18 = vpmulld_avx2(auVar6,auVar20);
  auVar24 = vpmulld_avx2(auVar7,auVar20);
  auVar18 = vpaddd_avx2(auVar18,auVar21);
  auVar23 = vpaddd_avx2(auVar18,auVar24);
  auVar13 = vpsubd_avx2(auVar18,auVar24);
  auVar18 = vpmulld_avx2(auVar4,auVar20);
  auVar18 = vpaddd_avx2(auVar18,auVar21);
  auVar25 = vpmulld_avx2((undefined1  [32])alVar5,auVar20);
  auVar24 = vpaddd_avx2(auVar18,auVar25);
  auVar18 = vpsubd_avx2(auVar18,auVar25);
  auVar19 = ZEXT416((uint)bit);
  in0 = (__m256i)vpsrad_avx2(auVar17,auVar19);
  auVar17 = vpmulld_avx2((undefined1  [32])in0,auVar20);
  auVar17 = vpaddd_avx2(auVar17,auVar21);
  auVar25 = vpsrad_avx2(auVar11,auVar19);
  auVar11 = vpsrad_avx2(auVar22,auVar19);
  alVar8 = (__m256i)vpsrad_avx2(auVar12,auVar19);
  in1 = (__m256i)vpsrad_avx2(auVar23,auVar19);
  auVar23 = vpsrad_avx2(auVar13,auVar19);
  alVar9 = (__m256i)vpsrad_avx2(auVar24,auVar19);
  auVar24 = vpsrad_avx2(auVar18,auVar19);
  auVar22 = vpmulld_avx2(auVar25,auVar20);
  auVar18 = vpaddd_avx2(auVar17,auVar22);
  auVar18 = vpsrad_avx2(auVar18,ZEXT416((uint)bit));
  auVar17 = vpsubd_avx2(auVar17,auVar22);
  alVar10 = (__m256i)vpsrad_avx2(auVar17,ZEXT416((uint)bit));
  if (do_cols == 0) {
    bVar14 = 10;
    if (10 < bd) {
      bVar14 = (byte)bd;
    }
    local_a0 = 0x20 << (bVar14 & 0x1f);
    local_80 = -local_a0;
    local_a0 = local_a0 + -1;
    iStack_9c = local_a0;
    iStack_98 = local_a0;
    iStack_94 = local_a0;
    iStack_90 = local_a0;
    iStack_8c = local_a0;
    iStack_88 = local_a0;
    iStack_84 = local_a0;
    iStack_7c = local_80;
    iStack_78 = local_80;
    iStack_74 = local_80;
    iStack_70 = local_80;
    iStack_6c = local_80;
    iStack_68 = local_80;
    iStack_64 = local_80;
    neg_shift_avx2(in0,in1,out,out + 1,(__m256i *)&local_80,(__m256i *)&local_a0,out_shift);
    neg_shift_avx2(in0,in1,out + 2,out + 3,(__m256i *)&local_80,(__m256i *)&local_a0,out_shift);
    neg_shift_avx2(in0,in1,out + 4,out + 5,(__m256i *)&local_80,(__m256i *)&local_a0,out_shift);
    neg_shift_avx2(in0,in1,out + 6,out + 7,(__m256i *)&local_80,(__m256i *)&local_a0,out_shift);
    neg_shift_avx2(in0,in1,out + 8,out + 9,(__m256i *)&local_80,(__m256i *)&local_a0,out_shift);
    neg_shift_avx2(in0,in1,out + 10,out + 0xb,(__m256i *)&local_80,(__m256i *)&local_a0,out_shift);
    neg_shift_avx2(in0,in1,out + 0xc,out + 0xd,(__m256i *)&local_80,(__m256i *)&local_a0,out_shift);
    neg_shift_avx2(in0,in1,out + 0xe,out + 0xf,(__m256i *)&local_80,(__m256i *)&local_a0,out_shift);
  }
  else {
    *out = alVar2;
    auVar17 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    alVar2 = (__m256i)vpsubd_avx2(auVar17,auVar4);
    out[1] = alVar2;
    out[2][0] = in0[0];
    out[2][1] = in0[1];
    out[2][2] = in0[2];
    out[2][3] = in0[3];
    alVar2 = (__m256i)vpsubd_avx2(auVar17,auVar6);
    out[3] = alVar2;
    out[4][0] = in1[0];
    out[4][1] = in1[1];
    out[4][2] = in1[2];
    out[4][3] = in1[3];
    alVar2 = (__m256i)vpsubd_avx2(auVar17,auVar18);
    out[5] = alVar2;
    out[6] = alVar9;
    alVar2 = (__m256i)vpsubd_avx2(auVar17,auVar11);
    out[7] = alVar2;
    out[8] = alVar8;
    alVar2 = (__m256i)vpsubd_avx2(auVar17,auVar24);
    out[9] = alVar2;
    out[10] = alVar10;
    alVar2 = (__m256i)vpsubd_avx2(auVar17,auVar23);
    out[0xb] = alVar2;
    local_200 = auVar7._0_8_;
    lStack_1f8 = auVar7._8_8_;
    lStack_1f0 = auVar7._16_8_;
    lStack_1e8 = auVar7._24_8_;
    out[0xc][0] = local_200;
    out[0xc][1] = lStack_1f8;
    out[0xc][2] = lStack_1f0;
    out[0xc][3] = lStack_1e8;
    alVar2 = (__m256i)vpsubd_avx2(auVar17,auVar25);
    out[0xd] = alVar2;
    out[0xe] = alVar5;
    alVar2 = (__m256i)vpsubd_avx2(auVar17,auVar3);
    out[0xf] = alVar2;
  }
  return;
}

Assistant:

static void iadst16_low1_avx2(const __m256i *input, __m256i *output) {
  const int32_t *cospi = cospi_arr(INV_COS_BIT);
  const __m256i _r = _mm256_set1_epi32(1 << (INV_COS_BIT - 1));

  const __m256i cospi_p08_p56 = pair_set_w16_epi16(cospi[8], cospi[56]);
  const __m256i cospi_p56_m08 = pair_set_w16_epi16(cospi[56], -cospi[8]);
  const __m256i cospi_p16_p48 = pair_set_w16_epi16(cospi[16], cospi[48]);
  const __m256i cospi_p48_m16 = pair_set_w16_epi16(cospi[48], -cospi[16]);

  // stage 1
  __m256i x1[16];
  x1[1] = input[0];

  // stage 2
  btf_16_w16_0_avx2(cospi[62], -cospi[2], x1[1], x1[0], x1[1]);

  // stage 3
  x1[8] = x1[0];
  x1[9] = x1[1];

  // stage 4
  btf_16_w16_avx2(cospi_p08_p56, cospi_p56_m08, &x1[8], &x1[9], _r,
                  INV_COS_BIT);

  // stage 5
  x1[4] = x1[0];
  x1[5] = x1[1];

  x1[12] = x1[8];
  x1[13] = x1[9];

  // stage 6
  btf_16_w16_avx2(cospi_p16_p48, cospi_p48_m16, &x1[4], &x1[5], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_p16_p48, cospi_p48_m16, &x1[12], &x1[13], _r,
                  INV_COS_BIT);

  // stage 7
  x1[2] = x1[0];
  x1[3] = x1[1];
  x1[6] = x1[4];
  x1[7] = x1[5];
  x1[10] = x1[8];
  x1[11] = x1[9];
  x1[14] = x1[12];
  x1[15] = x1[13];

  iadst16_stage8_avx2(x1, cospi, _r, INV_COS_BIT);
  iadst16_stage9_avx2(output, x1);
}